

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  cmGeneratorTarget *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  cmValue cVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  string *c2;
  LinkClosure *pLVar9;
  byte bVar10;
  string *li;
  pointer pbVar11;
  byte bVar12;
  pointer pbVar13;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_02;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  string install_rpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string dirVar;
  string rootPath;
  string d;
  string targetOutputDir;
  undefined1 local_170 [48];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_140;
  string *local_138;
  undefined1 local_130 [32];
  _Base_ptr local_110;
  size_t local_108;
  string *local_100;
  string *local_f8;
  undefined1 local_f0 [48];
  string local_c0;
  string *local_a0;
  string local_98;
  pointer local_78;
  string local_70;
  string local_50;
  
  pcVar1 = this->Makefile;
  local_140 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"CMAKE_SKIP_RPATH",(allocator<char> *)local_170);
  bVar4 = cmMakefile::IsOn(pcVar1,(string *)local_130);
  sVar2 = (this->RuntimeFlag)._M_string_length;
  std::__cxx11::string::~string((string *)local_130);
  bVar5 = true;
  if (!for_install) {
    pcVar3 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_130,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)local_170);
    bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)local_130);
    std::__cxx11::string::~string((string *)local_130);
  }
  if (bVar4 || sVar2 == 0) {
    bVar12 = 0;
LAB_002f3c87:
    bVar10 = 0;
    bVar6 = false;
  }
  else {
    bVar4 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target,&this->Config);
    bVar6 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    bVar12 = bVar6 & (bVar5 ^ 1U);
    if ((bVar5 ^ 1U) != 0) goto LAB_002f3c87;
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_130,"CMAKE_SKIP_INSTALL_RPATH",(allocator<char> *)local_f0);
    bVar6 = cmMakefile::IsOn(pcVar1,(string *)local_130);
    if (bVar6) {
      bVar6 = false;
    }
    else {
      pcVar3 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_170,"INSTALL_RPATH_USE_LINK_PATH",(allocator<char> *)&local_70);
      bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)local_170);
      std::__cxx11::string::~string((string *)local_170);
    }
    bVar10 = bVar5 & bVar4;
    std::__cxx11::string::~string((string *)local_130);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN",
             (allocator<char> *)local_170);
  local_f8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_130);
  std::__cxx11::string::~string((string *)local_130);
  local_100 = &this->Config;
  cmGeneratorTarget::GetDirectory(&local_70,this->Target,local_100,RuntimeBinaryArtifact);
  pcVar3 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"BUILD_RPATH_USE_ORIGIN",(allocator<char> *)local_170);
  bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)local_130);
  sVar2 = local_f8->_M_string_length;
  std::__cxx11::string::~string((string *)local_130);
  local_130._24_8_ = local_130 + 8;
  local_130._8_4_ = _S_red;
  local_130._16_8_ = 0;
  local_108 = 0;
  local_110 = (_Base_ptr)local_130._24_8_;
  if (bVar10 != 0) {
    local_170._8_8_ = (pointer)0x0;
    local_170[0x10] = '\0';
    local_170._0_8_ = local_170 + 0x10;
    cmGeneratorTarget::GetInstallRPATH(this->Target,local_100,(string *)local_170);
    cmCLI_ExpandListUnique
              ((string *)local_170,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_140,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_130);
    std::__cxx11::string::~string((string *)local_170);
  }
  if (bVar12 == 0) {
    if (bVar6 == false) goto LAB_002f43fa;
  }
  else {
    local_170._8_8_ = (pointer)0x0;
    local_170[0x10] = '\0';
    local_170._0_8_ = local_170 + 0x10;
    bVar5 = cmGeneratorTarget::GetBuildRPATH(this->Target,local_100,(string *)local_170);
    if (bVar5) {
      cmCLI_ExpandListUnique
                ((string *)local_170,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_140,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_130);
    }
    std::__cxx11::string::~string((string *)local_170);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_170,"CMAKE_SYSROOT_LINK",(allocator<char> *)local_f0);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)local_170);
  std::__cxx11::string::~string((string *)local_170);
  if (cVar7.Value == (string *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_170,"CMAKE_SYSROOT",(allocator<char> *)local_f0);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)local_170);
    std::__cxx11::string::_M_assign((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_170);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_c0);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_170,"CMAKE_STAGING_PREFIX",(allocator<char> *)local_f0);
  cVar7 = cmMakefile::GetDefinition(pcVar1,(string *)local_170);
  std::__cxx11::string::~string((string *)local_170);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_170,"CMAKE_INSTALL_PREFIX",(allocator<char> *)local_f0);
  local_a0 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_170);
  std::__cxx11::string::~string((string *)local_170);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_c0);
  pvVar8 = GetRuntimeSearchPath_abi_cxx11_(this);
  local_138 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  pbVar13 = (pvVar8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_78 = pbVar13;
  for (pbVar11 = (pvVar8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar13;
      pbVar11 = pbVar11 + 1) {
    if (bVar12 == 0) {
      if (bVar6 != false) {
        c2 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
        bVar5 = cmsys::SystemTools::ComparePath(pbVar11,c2);
        if (!bVar5) {
          bVar5 = cmsys::SystemTools::ComparePath(pbVar11,local_138);
          if (bVar5) goto LAB_002f42ff;
          bVar5 = cmsys::SystemTools::IsSubDirectory(pbVar11,c2);
          if (bVar5) goto LAB_002f42ff;
          bVar5 = cmsys::SystemTools::IsSubDirectory(pbVar11,local_138);
          if (bVar5) goto LAB_002f42ff;
          std::__cxx11::string::string((string *)&local_98,(string *)pbVar11);
          if (local_c0._M_string_length == 0) {
LAB_002f4308:
            if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
              str_02._M_str = local_98._M_dataplus._M_p;
              str_02._M_len = local_98._M_string_length;
              prefix_02._M_str = ((cVar7.Value)->_M_dataplus)._M_p;
              prefix_02._M_len = (cVar7.Value)->_M_string_length;
              bVar5 = cmHasPrefix(str_02,prefix_02);
              if (bVar5) {
                std::__cxx11::string::erase((ulong)&local_98,0);
                local_170._8_8_ = (local_a0->_M_dataplus)._M_p;
                local_170._0_8_ = local_a0->_M_string_length;
                local_f0._0_8_ = (pointer)0x1;
                local_f0._8_8_ = local_f0 + 0x10;
                local_f0[0x10] = '/';
                cmStrCat<std::__cxx11::string>
                          (&local_50,(cmAlphaNum *)local_170,(cmAlphaNum *)local_f0,&local_98);
                std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
                std::__cxx11::string::~string((string *)&local_50);
                cmsys::SystemTools::ConvertToUnixSlashes(&local_98);
              }
            }
          }
          else {
            str_00._M_str = local_98._M_dataplus._M_p;
            str_00._M_len = local_98._M_string_length;
            prefix_00._M_str = local_c0._M_dataplus._M_p;
            prefix_00._M_len = local_c0._M_string_length;
            bVar5 = cmHasPrefix(str_00,prefix_00);
            if (!bVar5) goto LAB_002f4308;
            std::__cxx11::string::erase((ulong)&local_98,0);
          }
          pVar14 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_130,&local_98);
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_140,&local_98);
          }
          goto LAB_002f42f7;
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_98,(string *)pbVar11);
      if (local_c0._M_string_length == 0) {
LAB_002f4124:
        if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
          str_01._M_str = local_98._M_dataplus._M_p;
          str_01._M_len = local_98._M_string_length;
          prefix_01._M_str = ((cVar7.Value)->_M_dataplus)._M_p;
          prefix_01._M_len = (cVar7.Value)->_M_string_length;
          bVar5 = cmHasPrefix(str_01,prefix_01);
          if (bVar5) {
            std::__cxx11::string::erase((ulong)&local_98,0);
            local_170._8_8_ = (local_a0->_M_dataplus)._M_p;
            local_170._0_8_ = local_a0->_M_string_length;
            local_f0._0_8_ = (pointer)0x1;
            local_f0._8_8_ = local_f0 + 0x10;
            local_f0[0x10] = '/';
            cmStrCat<std::__cxx11::string>
                      (&local_50,(cmAlphaNum *)local_170,(cmAlphaNum *)local_f0,&local_98);
            std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            cmsys::SystemTools::ConvertToUnixSlashes(&local_98);
            goto LAB_002f42d8;
          }
        }
        if ((bVar4 && local_70._M_string_length != 0) && sVar2 != 0) {
          bVar5 = cmsys::SystemTools::ComparePath(&local_98,local_138);
          if (!bVar5) {
            bVar5 = cmsys::SystemTools::IsSubDirectory(&local_98,local_138);
            if (!bVar5) goto LAB_002f42d8;
          }
          cmSystemTools::RelativePath((string *)local_170,&local_70,&local_98);
          std::__cxx11::string::operator=((string *)&local_98,(string *)local_170);
          std::__cxx11::string::~string((string *)local_170);
          if (local_98._M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)&local_98);
          }
          else {
            local_170._8_8_ = (local_f8->_M_dataplus)._M_p;
            local_170._0_8_ = local_f8->_M_string_length;
            local_f0._0_8_ = (pointer)0x1;
            local_f0._8_8_ = "/";
            cmStrCat<std::__cxx11::string>
                      (&local_50,(cmAlphaNum *)local_170,(cmAlphaNum *)local_f0,&local_98);
            std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            pbVar13 = local_78;
          }
        }
      }
      else {
        str._M_str = local_98._M_dataplus._M_p;
        str._M_len = local_98._M_string_length;
        prefix._M_str = local_c0._M_dataplus._M_p;
        prefix._M_len = local_c0._M_string_length;
        bVar5 = cmHasPrefix(str,prefix);
        if (!bVar5) goto LAB_002f4124;
        std::__cxx11::string::erase((ulong)&local_98,0);
      }
LAB_002f42d8:
      pVar14 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)local_130,&local_98);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_140,&local_98);
      }
LAB_002f42f7:
      std::__cxx11::string::~string((string *)&local_98);
    }
LAB_002f42ff:
  }
  std::__cxx11::string::~string((string *)&local_c0);
LAB_002f43fa:
  pLVar9 = cmGeneratorTarget::GetLinkClosure(this->Target,local_100);
  pbVar13 = (pLVar9->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar11 = (pLVar9->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar13;
      pbVar11 = pbVar11 + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   "CMAKE_",pbVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)local_f0);
    bVar4 = cmMakefile::IsOn(this->Makefile,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_170);
    if (bVar4) {
      std::operator+(&local_c0,"CMAKE_",pbVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     &local_c0,"_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&local_c0);
      cVar7 = cmMakefile::GetDefinition
                        (this->Makefile,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
      if (cVar7.Value != (string *)0x0) {
        cmCLI_ExpandListUnique
                  (cVar7.Value,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_140,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_130);
      }
      std::__cxx11::string::~string((string *)local_f0);
    }
    std::__cxx11::string::~string((string *)local_170);
  }
  cmCLI_ExpandListUnique
            (&this->RuntimeAlways,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_140,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_130);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_130);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected
      // to do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (cmValue sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = *sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    cmValue stagePath = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
          d.erase(0, rootPath.size());
        } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
          d.erase(0, (*stagePath).size());
          d = cmStrCat(installPrefix, '/', d);
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = cmStrCat(originToken, "/", d);
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
            d.erase(0, rootPath.size());
          } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
            d.erase(0, (*stagePath).size());
            d = cmStrCat(installPrefix, '/', d);
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (cmValue dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(*dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways, runtimeDirs, emitted);
}